

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
* __thiscall
testing::internal::UnorderedElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
           *__return_storage_ptr__,UnorderedElementsAreMatcher *this)

{
  UnorderedElementsAreMatcherImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
  *this_00;
  undefined4 *puVar1;
  MatcherVec matchers;
  IterateOverTuple<std::tuple<const_char_*,_const_char_*>,_2UL> local_29;
  vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  local_28;
  
  local_28.
  super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ::reserve(&local_28,2);
  TransformTupleValuesHelper<std::tuple<const_char_*,_const_char_*>,_testing::internal::CastAndAppendTransform<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>_>
  ::IterateOverTuple<std::tuple<const_char_*,_const_char_*>,_2UL>::operator()
            (&local_29,this,&local_28);
  this_00 = (UnorderedElementsAreMatcherImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
             *)operator_new(0x40);
  UnorderedElementsAreMatcherImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
  ::
  UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::__cxx11::string_const&>*,std::vector<testing::Matcher<std::__cxx11::string_const&>,std::allocator<testing::Matcher<std::__cxx11::string_const&>>>>>
            (this_00,ExactMatch,
             (__normal_iterator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>
              )local_28.
               super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>
              )local_28.
               super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_018765f0;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ).buffer_.ptr = (void *)0x0;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ).vtable_ = (VTable *)
              MatcherBase<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
              ::
              GetVTable<testing::internal::MatcherBase<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>::ValuePolicy<testing::MatcherInterface<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>const*,true>>()
              ::kVTable_abi_cxx11_;
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(UnorderedElementsAreMatcherImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
    **)(puVar1 + 2) = this_00;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ).buffer_.ptr = puVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_01876580;
  std::
  vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ::~vector(&local_28);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&>> MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(
        new UnorderedElementsAreMatcherImpl<const Container&>(
            UnorderedMatcherRequire::ExactMatch, matchers.begin(),
            matchers.end()));
  }